

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

mz_bool mz_zip_writer_add_mem_ex_v2
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32,time_t *last_modified,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  mz_zip_internal_state *pArray;
  int iVar1;
  mz_uint16 filename_size;
  char *user_extra_data_00;
  tdefl_compressor *d;
  undefined1 uVar2;
  mz_uint16 extra_size;
  mz_bool mVar3;
  tdefl_status tVar4;
  time_t *ptVar6;
  size_t sVar7;
  mz_uint64 *pmVar8;
  size_t sVar9;
  size_t sVar10;
  sbyte sVar11;
  mz_uint64 *pmVar12;
  sbyte sVar13;
  uint uVar14;
  ulong uVar15;
  mz_uint64 *pmVar16;
  ushort bit_flags;
  sbyte sVar17;
  uint uVar18;
  mz_uint64 *pmVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  uint uVar22;
  byte bVar23;
  mz_uint64 mVar24;
  bool bVar25;
  byte local_115;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  undefined8 local_110;
  size_t local_108;
  mz_uint64 comp_size;
  mz_uint64 local_f8;
  char *local_f0;
  tdefl_compressor *local_e8;
  mz_uint64 local_dir_header_ofs;
  mz_zip_writer_add_state state;
  time_t cur_time;
  undefined1 uStack_a0;
  undefined1 uStack_9f;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  undefined1 uStack_9c;
  undefined1 uStack_9b;
  undefined2 uStack_9a;
  undefined6 uStack_98;
  long lStack_92;
  ulong local_80;
  mz_uint8 *local_78;
  ulong local_70;
  undefined8 local_68;
  void *local_60;
  mz_uint8 extra_data [28];
  mz_uint32 mVar5;
  
  dos_time = 0;
  dos_date = 0;
  local_f8 = pZip->m_archive_size;
  comp_size = 0;
  uVar14 = 6;
  if (-1 < (int)level_and_flags) {
    uVar14 = level_and_flags;
  }
  if ((uncomp_size == 0) && ((uVar14 >> 10 & 1) != 0 || buf_size == 0)) {
    bit_flags = 0;
  }
  else {
    bit_flags = 8;
  }
  if ((uVar14 >> 0x10 & 1) == 0) {
    bit_flags = bit_flags + 0x800;
  }
  uVar22 = uVar14 & 0xf;
  pArray = pZip->m_pState;
  if ((pArray == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
LAB_0011e6b9:
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    return 0;
  }
  if ((pArchive_name == (char *)0x0) ||
     ((pBuf == (void *)0x0 && buf_size != 0 ||
      (pComment == (void *)0x0 && comment_size != 0 || 10 < uVar22)))) goto LAB_0011e6b9;
  if (pArray->m_zip64 == 0) {
    if ((uncomp_size | buf_size) >> 0x20 != 0 || pZip->m_total_files == 0xffff) {
      pArray->m_zip64 = 1;
    }
  }
  else if (pZip->m_total_files == 0xffffffff) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      return 0;
    }
    return 0;
  }
  if (uncomp_size != 0 && (uVar14 >> 10 & 1) == 0) goto LAB_0011e6b9;
  if (*pArchive_name == '/') {
LAB_0011e7b7:
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
      return 0;
    }
    return 0;
  }
  local_110 = (mz_uint8 *)(CONCAT44(local_110._4_4_,uVar14 >> 10) & 0xffffffff00000001);
  local_78 = (mz_uint8 *)pBuf;
  local_60 = pComment;
  ptVar6 = last_modified;
  local_108 = buf_size;
  local_f0 = pArchive_name;
  local_dir_header_ofs = local_f8;
  if (last_modified == (time_t *)0x0) {
    time(&cur_time);
    ptVar6 = &cur_time;
  }
  mz_zip_time_t_to_dos_time(*ptVar6,&dos_time,&dos_date);
  local_115 = uVar22 == 0 | (byte)local_110;
  if ((uVar14 >> 10 & 1) == 0) {
    local_80 = mz_crc32(0,local_78,local_108);
    uncomp_size = local_108;
    if (local_108 < 4) {
      uVar22 = 0;
    }
    local_115 = local_115 | local_108 < 4;
  }
  else {
    local_80 = (ulong)uncomp_crc32;
  }
  sVar7 = strlen(local_f0);
  if (0xffff < sVar7) goto LAB_0011e7b7;
  if (pZip->m_file_offset_alignment == 0) {
    uVar14 = 0;
  }
  else {
    iVar1 = (int)pZip->m_file_offset_alignment;
    uVar14 = iVar1 - 1;
    uVar14 = iVar1 - ((uint)pZip->m_archive_size & uVar14) & uVar14;
  }
  sVar9 = (pArray->m_central_dir).m_size;
  local_70 = (ulong)comment_size;
  if (0xfffffffe < sVar9 + local_70 + sVar7 + 0x4a) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
      return 0;
    }
    return 0;
  }
  if ((pArray->m_zip64 == 0) &&
     ((pZip->m_archive_size +
      user_extra_data_len + local_70 + (ulong)user_extra_data_central_len + sVar7 * 2 +
      (ulong)uVar14 + sVar9) - 0xffffff8e < 0xffffffff00000000)) {
    pArray->m_zip64 = 1;
  }
  local_68 = 0;
  if (((sVar7 != 0) && (local_f0[sVar7 - 1] == '/')) &&
     (local_68 = 0x10, uncomp_size != 0 || local_108 != 0)) goto LAB_0011e6b9;
  sVar10 = sVar9 + 0x1c;
  if (pArray->m_zip64 == 0) {
    sVar10 = sVar9;
  }
  uVar15 = sVar10 + local_70 + sVar7 + 0x2e;
  if ((((pArray->m_central_dir).m_capacity < uVar15) &&
      (mVar3 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar15,1), mVar3 == 0)) ||
     ((uVar15 = (pArray->m_central_dir_offsets).m_size + 1,
      (pArray->m_central_dir_offsets).m_capacity < uVar15 &&
      (mVar3 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar15,1),
      mVar3 == 0)))) {
LAB_0011e9ff:
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      return 0;
    }
    return 0;
  }
  if (local_108 == 0 || local_115 != 0) {
    local_e8 = (tdefl_compressor *)0x0;
  }
  else {
    local_e8 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
    if (local_e8 == (tdefl_compressor *)0x0) goto LAB_0011e9ff;
  }
  mVar3 = mz_zip_writer_write_zeros(pZip,local_f8,uVar14);
  if (mVar3 == 0) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_e8);
    return 0;
  }
  local_dir_header_ofs = local_dir_header_ofs + uVar14;
  if ((pZip->m_file_offset_alignment != 0) &&
     ((pZip->m_file_offset_alignment - 1 & local_dir_header_ofs) != 0)) {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyexr/deps/miniz/miniz.c"
                  ,0x18d6,
                  "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                 );
  }
  local_f8 = local_f8 + uVar14;
  uStack_98 = 0;
  lStack_92 = 0;
  cur_time = 0;
  uStack_a0 = 0;
  uStack_9f = 0;
  uStack_9e = 0;
  uStack_9d = 0;
  uStack_9c = 0;
  uStack_9b = 0;
  uStack_9a = 0;
  bVar23 = local_115 ^ 1 | (byte)local_110;
  uVar21 = (undefined1)(bit_flags >> 8);
  uVar20 = (undefined1)((ushort)bVar23 << 3);
  filename_size = (mz_uint16)sVar7;
  if (pArray->m_zip64 == 0) {
    if ((comp_size._4_4_ != 0) || (local_f8 >> 0x20 != 0)) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
        return 0;
      }
      return 0;
    }
    uVar2 = 0x14;
    if (bVar23 == 0) {
      uVar2 = 0;
    }
    cur_time._0_5_ = CONCAT14(uVar2,0x4034b50);
    cur_time._0_6_ = (uint6)(uint5)cur_time;
    cur_time._0_7_ = CONCAT16((char)bit_flags,(uint6)cur_time);
    cur_time = CONCAT17(uVar21,(undefined7)cur_time);
    uStack_9f = 0;
    uStack_9e = (undefined1)dos_time;
    uStack_9d = (undefined1)(dos_time >> 8);
    uStack_9c = (undefined1)dos_date;
    uStack_9b = (undefined1)(dos_date >> 8);
    uStack_9a = 0;
    uStack_98 = 0;
    lStack_92 = (ulong)CONCAT13((char)(user_extra_data_len >> 8),
                                CONCAT12((char)user_extra_data_len,filename_size)) << 0x20;
    uStack_a0 = uVar20;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,&cur_time,0x1e);
    if (sVar9 != 0x1e) goto LAB_0011eda4;
    mVar24 = local_f8 + 0x1e;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar24,local_f0,sVar7);
    if (sVar9 != sVar7) goto LAB_0011ec5f;
    mVar24 = mVar24 + sVar7;
    local_110 = (mz_uint8 *)0x0;
    uVar14 = 0;
  }
  else {
    if ((uncomp_size < 0xffffffff) && (local_dir_header_ofs < 0xffffffff)) {
      local_110 = (mz_uint8 *)0x0;
      uVar14 = 0;
    }
    else {
      pmVar19 = (mz_uint64 *)0x0;
      pmVar8 = &uncomp_size;
      if (uncomp_size < 0xffffffff) {
        pmVar8 = pmVar19;
      }
      pmVar16 = &comp_size;
      if (uncomp_size < 0xffffffff) {
        pmVar16 = pmVar19;
      }
      pmVar12 = &local_dir_header_ofs;
      if (local_dir_header_ofs < 0xffffffff) {
        pmVar12 = pmVar19;
      }
      local_110 = extra_data;
      uVar14 = mz_zip_writer_create_zip64_extra_data(local_110,pmVar8,pmVar16,pmVar12);
    }
    uVar2 = 0x14;
    if (bVar23 == 0) {
      uVar2 = 0;
    }
    cur_time._0_5_ = CONCAT14(uVar2,0x4034b50);
    cur_time._0_6_ = (uint6)(uint5)cur_time;
    cur_time._0_7_ = CONCAT16((char)bit_flags,(uint6)cur_time);
    cur_time = CONCAT17(uVar21,(undefined7)cur_time);
    uStack_9f = 0;
    uStack_9e = (undefined1)dos_time;
    uStack_9d = (undefined1)(dos_time >> 8);
    uStack_9c = (undefined1)dos_date;
    uStack_9b = (undefined1)(dos_date >> 8);
    uStack_9a = 0;
    uStack_98 = 0;
    lStack_92 = (ulong)CONCAT13((char)(uVar14 + user_extra_data_len >> 8),
                                CONCAT12((char)(uVar14 + user_extra_data_len),filename_size)) <<
                0x20;
    uStack_a0 = uVar20;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,&cur_time,0x1e);
    if (sVar9 != 0x1e) goto LAB_0011eda4;
    mVar24 = local_f8 + 0x1e;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar24,local_f0,sVar7);
    if (sVar9 != sVar7) {
LAB_0011ec5f:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_e8);
      goto LAB_0011eda4;
    }
    mVar24 = mVar24 + sVar7;
    if (local_110 == (mz_uint8 *)0x0) {
      local_110 = (mz_uint8 *)0x0;
    }
    else {
      uVar15 = (ulong)uVar14;
      sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar24,extra_data,uVar15);
      if (sVar9 != uVar15) goto LAB_0011eda4;
      mVar24 = mVar24 + uVar15;
    }
  }
  extra_size = (mz_uint16)uVar14;
  if (user_extra_data_len != 0) {
    uVar15 = (ulong)user_extra_data_len;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar24,user_extra_data,uVar15);
    if (sVar9 != uVar15) goto LAB_0011eda4;
    mVar24 = mVar24 + uVar15;
  }
  d = local_e8;
  sVar9 = local_108;
  if (local_115 == 0) {
    if (local_108 != 0) {
      state.m_comp_size = 0;
      uVar15 = 10;
      if (uVar22 < 10) {
        uVar15 = (ulong)uVar22;
      }
      uVar18 = (uint)(uVar22 < 4) << 0xe |
               tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar15];
      uVar14 = uVar18 | 0x80000;
      if (uVar22 != 0) {
        uVar14 = uVar18;
      }
      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = mVar24;
      tdefl_init(local_e8,mz_zip_writer_add_put_buf_callback,&state,uVar14);
      tVar4 = tdefl_compress_buffer(d,local_78,local_108,TDEFL_FINISH);
      if (tVar4 == TDEFL_STATUS_DONE) {
        comp_size = state.m_comp_size;
        mVar24 = state.m_cur_archive_file_ofs;
      }
      else {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_e8);
        if (pZip != (mz_zip_archive *)0x0) {
          pZip->m_last_error = MZ_ZIP_COMPRESSION_FAILED;
        }
      }
      if (tVar4 != TDEFL_STATUS_DONE) {
        return 0;
      }
    }
  }
  else {
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar24,local_78,local_108);
    if (sVar10 != sVar9) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_e8);
LAB_0011eda4:
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
        return 0;
      }
      return 0;
    }
    mVar24 = mVar24 + local_108;
    comp_size = local_108;
  }
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_e8);
  if (uncomp_size == 0) goto LAB_0011ef63;
  if ((bit_flags & 8) == 0) {
    __assert_fail("bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyexr/deps/miniz/miniz.c"
                  ,0x1943,
                  "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                 );
  }
  state.m_pZip = (mz_zip_archive *)
                 CONCAT17((char)(local_80 >> 0x18),
                          CONCAT16((char)(local_80 >> 0x10),
                                   CONCAT15((char)(local_80 >> 8),CONCAT14((char)local_80,0x8074b50)
                                           )));
  uVar21 = (undefined1)uncomp_size;
  if (local_110 == (mz_uint8 *)0x0) {
    if (comp_size >> 0x20 == 0) {
      pmVar8 = &state.m_cur_archive_file_ofs;
      pmVar19 = &state.m_cur_archive_file_ofs;
      pmVar16 = &state.m_cur_archive_file_ofs;
      state.m_cur_archive_file_ofs = CONCAT44(state.m_cur_archive_file_ofs._4_4_,(int)comp_size);
      sVar17 = 0x18;
      sVar13 = 0x10;
      sVar11 = 8;
      pmVar12 = &state.m_cur_archive_file_ofs;
      sVar9 = 0x10;
      goto LAB_0011ef1c;
    }
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
    }
    bVar25 = false;
  }
  else {
    pmVar8 = &state.m_comp_size;
    pmVar19 = &state.m_comp_size;
    pmVar16 = &state.m_comp_size;
    state.m_cur_archive_file_ofs = comp_size;
    state.m_comp_size._0_4_ = (undefined4)uncomp_size;
    pmVar12 = &state.m_comp_size;
    uVar21 = (undefined1)(uncomp_size >> 0x20);
    sVar9 = 0x18;
    sVar17 = 0x38;
    sVar13 = 0x30;
    sVar11 = 0x28;
LAB_0011ef1c:
    *(undefined1 *)((long)pmVar12 + 4) = uVar21;
    *(char *)((long)pmVar16 + 5) = (char)(uncomp_size >> sVar11);
    *(char *)((long)pmVar19 + 6) = (char)(uncomp_size >> sVar13);
    *(char *)((long)pmVar8 + 7) = (char)(uncomp_size >> sVar17);
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar24,&state,sVar9);
    bVar25 = sVar10 == sVar9;
    sVar10 = 0;
    if (bVar25) {
      sVar10 = sVar9;
    }
    mVar24 = mVar24 + sVar10;
  }
  if (!bVar25) {
    return 0;
  }
LAB_0011ef63:
  user_extra_data_00 = user_extra_data_central;
  if (local_110 != (mz_uint8 *)0x0) {
    pmVar8 = (mz_uint64 *)0x0;
    pmVar19 = &uncomp_size;
    if (uncomp_size < 0xffffffff) {
      pmVar19 = pmVar8;
    }
    pmVar16 = &comp_size;
    if (uncomp_size < 0xffffffff) {
      pmVar16 = pmVar8;
    }
    if (0xfffffffe < local_dir_header_ofs) {
      pmVar8 = &local_dir_header_ofs;
    }
    mVar5 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar19,pmVar16,pmVar8);
    extra_size = (mz_uint16)mVar5;
  }
  mVar3 = mz_zip_writer_add_to_central_dir
                    (pZip,local_f0,filename_size,local_110,extra_size,local_60,(mz_uint16)local_70,
                     uncomp_size,comp_size,(mz_uint32)local_80,(ushort)bVar23 << 3,bit_flags,
                     dos_time,dos_date,local_dir_header_ofs,(mz_uint32)local_68,user_extra_data_00,
                     user_extra_data_central_len);
  if (mVar3 == 0) {
    return 0;
  }
  pZip->m_total_files = pZip->m_total_files + 1;
  pZip->m_archive_size = mVar24;
  return 1;
}

Assistant:

mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *pZip, const char *pArchive_name, const void *pBuf, size_t buf_size, const void *pComment, mz_uint16 comment_size,
                                    mz_uint level_and_flags, mz_uint64 uncomp_size, mz_uint32 uncomp_crc32, MZ_TIME_T *last_modified,
                                    const char *user_extra_data, mz_uint user_extra_data_len, const char *user_extra_data_central, mz_uint user_extra_data_central_len)
{
    mz_uint16 method = 0, dos_time = 0, dos_date = 0;
    mz_uint level, ext_attributes = 0, num_alignment_padding_bytes;
    mz_uint64 local_dir_header_ofs = pZip->m_archive_size, cur_archive_file_ofs = pZip->m_archive_size, comp_size = 0;
    size_t archive_name_size;
    mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
    tdefl_compressor *pComp = NULL;
    mz_bool store_data_uncompressed;
    mz_zip_internal_state *pState;
    mz_uint8 *pExtra_data = NULL;
    mz_uint32 extra_size = 0;
    mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
    mz_uint16 bit_flags = 0;

    if ((int)level_and_flags < 0)
        level_and_flags = MZ_DEFAULT_LEVEL;

    if (uncomp_size || (buf_size && !(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)))
        bit_flags |= MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;

    if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
        bit_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

    level = level_and_flags & 0xF;
    store_data_uncompressed = ((!level) || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA));

    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || ((buf_size) && (!pBuf)) || (!pArchive_name) || ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if (pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
        }
        if (((mz_uint64)buf_size > 0xFFFFFFFF) || (uncomp_size > 0xFFFFFFFF))
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (uncomp_size))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_writer_validate_archive_name(pArchive_name))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

#ifndef MINIZ_NO_TIME
    if (last_modified != NULL)
    {
        mz_zip_time_t_to_dos_time(*last_modified, &dos_time, &dos_date);
    }
    else
    {
        MZ_TIME_T cur_time;
        time(&cur_time);
        mz_zip_time_t_to_dos_time(cur_time, &dos_time, &dos_date);
    }
#endif /* #ifndef MINIZ_NO_TIME */

	if (!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
	{
		uncomp_crc32 = (mz_uint32)mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf, buf_size);
		uncomp_size = buf_size;
		if (uncomp_size <= 3)
		{
			level = 0;
			store_data_uncompressed = MZ_TRUE;
		}
	}

    archive_name_size = strlen(pArchive_name);
    if (archive_name_size > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
    if (((mz_uint64)pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    if (!pState->m_zip64)
    {
        /* Bail early if the archive would obviously become too large */
        if ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size
			+ MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size + user_extra_data_len +
			pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + user_extra_data_central_len
			+ MZ_ZIP_DATA_DESCRIPTER_SIZE32) > 0xFFFFFFFF)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((archive_name_size) && (pArchive_name[archive_name_size - 1] == '/'))
    {
        /* Set DOS Subdirectory attribute bit. */
        ext_attributes |= MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG;

        /* Subdirectories cannot contain data. */
        if ((buf_size) || (uncomp_size))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
    }

    /* Try to do any allocations before writing to the archive, so if an allocation fails the file remains unmodified. (A good idea if we're doing an in-place modification.) */
    if ((!mz_zip_array_ensure_room(pZip, &pState->m_central_dir, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size + (pState->m_zip64 ? MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE : 0))) || (!mz_zip_array_ensure_room(pZip, &pState->m_central_dir_offsets, 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    if ((!store_data_uncompressed) && (buf_size))
    {
        if (NULL == (pComp = (tdefl_compressor *)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor))))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes))
    {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        return MZ_FALSE;
    }

    local_dir_header_ofs += num_alignment_padding_bytes;
    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }
    cur_archive_file_ofs += num_alignment_padding_bytes;

    MZ_CLEAR_ARR(local_dir_header);

    if (!store_data_uncompressed || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
    {
        method = MZ_DEFLATED;
    }

    if (pState->m_zip64)
    {
        if (uncomp_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX)
        {
            pExtra_data = extra_data;
            extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                               (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
        }

        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, (mz_uint16)(extra_size + user_extra_data_len), 0, 0, 0, method, bit_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;

        if (pExtra_data != NULL)
        {
            if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data, extra_size) != extra_size)
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

            cur_archive_file_ofs += extra_size;
        }
    }
    else
    {
        if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, (mz_uint16)user_extra_data_len, 0, 0, 0, method, bit_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;
    }

	if (user_extra_data_len > 0)
	{
		if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, user_extra_data, user_extra_data_len) != user_extra_data_len)
			return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

		cur_archive_file_ofs += user_extra_data_len;
	}

    if (store_data_uncompressed)
    {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pBuf, buf_size) != buf_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += buf_size;
        comp_size = buf_size;
    }
    else if (buf_size)
    {
        mz_zip_writer_add_state state;

        state.m_pZip = pZip;
        state.m_cur_archive_file_ofs = cur_archive_file_ofs;
        state.m_comp_size = 0;

        if ((tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state, tdefl_create_comp_flags_from_zip_params(level, -15, MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY) ||
            (tdefl_compress_buffer(pComp, pBuf, buf_size, TDEFL_FINISH) != TDEFL_STATUS_DONE))
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
        }

        comp_size = state.m_comp_size;
        cur_archive_file_ofs = state.m_cur_archive_file_ofs;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    pComp = NULL;

    if (uncomp_size)
    {
        mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
        mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

        MZ_ASSERT(bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR);

        MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
        MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
        if (pExtra_data == NULL)
        {
            if (comp_size > MZ_UINT32_MAX)
                return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

            MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
        }
        else
        {
            MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
            local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_footer, local_dir_footer_size) != local_dir_footer_size)
            return MZ_FALSE;

        cur_archive_file_ofs += local_dir_footer_size;
    }

    if (pExtra_data != NULL)
    {
        extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                           (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
    }

    if (!mz_zip_writer_add_to_central_dir(pZip, pArchive_name, (mz_uint16)archive_name_size, pExtra_data, (mz_uint16)extra_size, pComment,
                                          comment_size, uncomp_size, comp_size, uncomp_crc32, method, bit_flags, dos_time, dos_date, local_dir_header_ofs, ext_attributes,
                                          user_extra_data_central, user_extra_data_central_len))
        return MZ_FALSE;

    pZip->m_total_files++;
    pZip->m_archive_size = cur_archive_file_ofs;

    return MZ_TRUE;
}